

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O2

bool presolve::dev_kkt_check::checkKkt(State *state,KktInfo *info)

{
  bool bVar1;
  uint in_EAX;
  mapped_type *pmVar2;
  ostream *poVar3;
  undefined8 uStack_38;
  
  if (state->numCol == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"KKT warning: empty problem");
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = true;
  }
  else {
    uStack_38._0_4_ = in_EAX;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uStack_38 = (ulong)(uint)uStack_38;
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    checkPrimalBounds(state,pmVar2);
    uStack_38 = CONCAT44(1,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    checkPrimalFeasMatrix(state,pmVar2);
    uStack_38 = CONCAT44(2,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    checkDualFeasibility(state,pmVar2);
    uStack_38 = CONCAT44(3,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    checkComplementarySlackness(state,pmVar2);
    uStack_38 = CONCAT44(4,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    checkStationarityOfLagrangian(state,pmVar2);
    uStack_38 = CONCAT44(5,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    checkBasicFeasibleSolution(state,pmVar2);
    uStack_38 = uStack_38 & 0xffffffff;
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    info->pass_col_bounds = pmVar2->violated == 0;
    uStack_38 = CONCAT44(1,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    info->pass_primal_feas_matrix = pmVar2->violated == 0;
    uStack_38 = CONCAT44(2,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    info->pass_dual_feas = pmVar2->violated == 0;
    uStack_38 = CONCAT44(3,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    info->pass_comp_slackness = pmVar2->violated == 0;
    uStack_38 = CONCAT44(4,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    info->pass_st_of_L = pmVar2->violated == 0;
    uStack_38 = CONCAT44(5,(uint)uStack_38);
    pmVar2 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[](&info->rules,(key_type *)((long)&uStack_38 + 4));
    info->pass_bfs = pmVar2->violated == 0;
    if ((((info->pass_primal_feas_matrix != true) || (info->pass_col_bounds != true)) ||
        (info->pass_dual_feas != true)) ||
       ((info->pass_comp_slackness != true || (bVar1 = true, info->pass_st_of_L == false)))) {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool checkKkt(const State& state, KktInfo& info) {
  if (state.numCol == 0) {
    std::cout << "KKT warning: empty problem" << std::endl;
    return true;
  }

  std::cout << std::endl;

  checkPrimalBounds(state, info.rules[KktCondition::kColBounds]);
  checkPrimalFeasMatrix(state, info.rules[KktCondition::kPrimalFeasibility]);
  checkDualFeasibility(state, info.rules[KktCondition::kDualFeasibility]);
  checkComplementarySlackness(
      state, info.rules[KktCondition::kComplementarySlackness]);
  checkStationarityOfLagrangian(
      state, info.rules[KktCondition::kStationarityOfLagrangian]);
  checkBasicFeasibleSolution(state,
                             info.rules[KktCondition::kBasicFeasibleSolution]);

  assert(info.rules.size() == 6);

  info.pass_col_bounds = info.rules[KktCondition::kColBounds].violated == 0;
  info.pass_primal_feas_matrix =
      info.rules[KktCondition::kPrimalFeasibility].violated == 0;
  info.pass_dual_feas =
      info.rules[KktCondition::kDualFeasibility].violated == 0;
  info.pass_comp_slackness =
      info.rules[KktCondition::kComplementarySlackness].violated == 0;
  info.pass_st_of_L =
      info.rules[KktCondition::kStationarityOfLagrangian].violated == 0;
  info.pass_bfs =
      info.rules[KktCondition::kBasicFeasibleSolution].violated == 0;

  if (info.pass_primal_feas_matrix && info.pass_col_bounds &&
      info.pass_dual_feas && info.pass_comp_slackness && info.pass_st_of_L)
    return true;

  return false;
}